

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_vector.hpp
# Opt level: O0

void tlx::
     SimpleVector<tlx::CountingPtr<foxxll::file,_tlx::CountingPtrDefaultDeleter>,_(tlx::SimpleVectorMode)0>
     ::destroy_array(CountingPtr<foxxll::file,_tlx::CountingPtrDefaultDeleter> *array,size_t size)

{
  file *pfVar1;
  CountingPtr<foxxll::file,_tlx::CountingPtrDefaultDeleter> *this;
  size_t size_local;
  CountingPtr<foxxll::file,_tlx::CountingPtrDefaultDeleter> *array_local;
  
  if (array != (CountingPtr<foxxll::file,_tlx::CountingPtrDefaultDeleter> *)0x0) {
    pfVar1 = array[-1].ptr_;
    this = array + (long)pfVar1;
    while (array != this) {
      this = this + -1;
      CountingPtr<foxxll::file,_tlx::CountingPtrDefaultDeleter>::~CountingPtr(this);
    }
    operator_delete__(array + -1,(long)pfVar1 * 8 + 8);
  }
  return;
}

Assistant:

static void destroy_array(ValueType* array, size_t size) {
        switch (Mode)
        {
        case SimpleVectorMode::Normal:
            // with normal object destruction
            delete[] array;
            return;
        case SimpleVectorMode::NoInitButDestroy:
            // destroy objects and deallocate memory
            for (size_t i = 0; i < size; ++i)
                array[i].~ValueType();
            operator delete (array);
            return;
        case SimpleVectorMode::NoInitNoDestroy:
            // only deallocate memory
            operator delete (array);
            return;
        }
        abort();
    }